

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O2

Matrix * __thiscall
sptk::Matrix::operator*(Matrix *__return_storage_ptr__,Matrix *this,Matrix *matrix)

{
  pointer ppdVar1;
  pointer ppdVar2;
  pointer ppdVar3;
  double *pdVar4;
  ulong uVar5;
  logic_error *this_00;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int k;
  ulong uVar11;
  
  if (this->num_column_ == matrix->num_row_) {
    Matrix(__return_storage_ptr__,this->num_row_,matrix->num_column_);
    uVar7 = 0;
    uVar6 = (ulong)(uint)matrix->num_column_;
    if (matrix->num_column_ < 1) {
      uVar6 = uVar7;
    }
    uVar5 = (ulong)(uint)this->num_row_;
    if (this->num_row_ < 1) {
      uVar5 = uVar7;
    }
    for (uVar8 = 0; uVar8 != uVar5; uVar8 = uVar8 + 1) {
      uVar9 = (ulong)(uint)this->num_column_;
      if (this->num_column_ < 1) {
        uVar9 = uVar7;
      }
      for (uVar10 = 0; uVar10 != uVar6; uVar10 = uVar10 + 1) {
        ppdVar1 = (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppdVar2 = (matrix->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppdVar3 = (__return_storage_ptr__->index_).
                  super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
          pdVar4 = ppdVar3[uVar8];
          pdVar4[uVar10] = ppdVar1[uVar8][uVar11] * ppdVar2[uVar11][uVar10] + pdVar4[uVar10];
        }
      }
    }
    return __return_storage_ptr__;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"Matrix: Matrix sizes do not match");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

Matrix Matrix::operator*(const Matrix& matrix) const {
  if (num_column_ != matrix.num_row_) {
    throw std::logic_error(kErrorMessageForLogicError);
  }
  Matrix result(num_row_, matrix.num_column_);
  for (int i(0); i < num_row_; ++i) {
    for (int j(0); j < matrix.num_column_; ++j) {
      for (int k(0); k < num_column_; ++k) {
        result.index_[i][j] += index_[i][k] * matrix.index_[k][j];
      }
    }
  }
  return result;
}